

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saa1099_mame.c
# Opt level: O2

void saa1099_envelope_w(saa1099_state *saa,int ch)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  
  if (saa->env_enable[(uint)ch] != '\0') {
    bVar1 = saa->env_step[(uint)ch] & 0x20 | saa->env_step[(uint)ch] + 1 & 0x3f;
    saa->env_step[(uint)ch] = bVar1;
    bVar4 = saa->env_bits[(uint)ch] == '\0' | 0xe;
    bVar1 = envelope[saa->env_mode[(uint)ch]][bVar1];
    bVar2 = bVar4 & bVar1;
    uVar5 = ch * 3 + 2;
    saa->channels[uVar5].envelope[0] = bVar2;
    uVar3 = ch * 3 + 1;
    saa->channels[uVar3].envelope[0] = bVar2;
    saa->channels[(uint)(ch * 3)].envelope[0] = bVar2;
    bVar1 = (bVar1 ^ 0xf) & bVar4;
    if ((saa->env_reverse_right[(uint)ch] & 1) == 0) {
      bVar1 = bVar2;
    }
    saa->channels[uVar5].envelope[1] = bVar1;
    saa->channels[uVar3].envelope[1] = bVar1;
    saa->channels[(uint)(ch * 3)].envelope[1] = bVar1;
    return;
  }
  uVar3 = ch * 3 + 2;
  saa->channels[uVar3].envelope[1] = '\x10';
  uVar5 = ch * 3 + 1;
  saa->channels[uVar5].envelope[1] = '\x10';
  saa->channels[(uint)(ch * 3)].envelope[1] = '\x10';
  saa->channels[uVar3].envelope[0] = '\x10';
  saa->channels[uVar5].envelope[0] = '\x10';
  saa->channels[(uint)(ch * 3)].envelope[0] = '\x10';
  return;
}

Assistant:

static void saa1099_envelope_w(saa1099_state *saa, int ch)
{
	if (saa->env_enable[ch])
	{
		UINT8 step, mode, mask, envval;
		mode = saa->env_mode[ch];
		/* step from 0..63 and then loop in steps 32..63 */
		step = saa->env_step[ch] =
			((saa->env_step[ch] + 1) & 0x3f) | (saa->env_step[ch] & 0x20);

		mask = 15;
		if (saa->env_bits[ch])
			mask &= ~1;     /* 3 bit resolution, mask LSB */

		envval = envelope[mode][step] & mask;
		saa->channels[ch*3+0].envelope[ LEFT] =
		saa->channels[ch*3+1].envelope[ LEFT] =
		saa->channels[ch*3+2].envelope[ LEFT] = envval;
		if (saa->env_reverse_right[ch] & 0x01)
			envval = (15 - envval) & mask;
		saa->channels[ch*3+0].envelope[RIGHT] =
		saa->channels[ch*3+1].envelope[RIGHT] =
		saa->channels[ch*3+2].envelope[RIGHT] = envval;
	}
	else
	{
		/* envelope mode off, set all envelope factors to 16 */
		saa->channels[ch*3+0].envelope[ LEFT] =
		saa->channels[ch*3+1].envelope[ LEFT] =
		saa->channels[ch*3+2].envelope[ LEFT] =
		saa->channels[ch*3+0].envelope[RIGHT] =
		saa->channels[ch*3+1].envelope[RIGHT] =
		saa->channels[ch*3+2].envelope[RIGHT] = 16;
	}
}